

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,Filters filters)

{
  long lVar1;
  Stream *pSVar2;
  QDebug *pQVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  QLatin1StringView latin1_09;
  QLatin1StringView latin1_10;
  QLatin1StringView latin1_11;
  QLatin1StringView latin1_12;
  QLatin1StringView latin1_13;
  QLatin1StringView latin1_14;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  QDebugStateSaver save;
  
  dbg = (QDebug *)
        CONCAT44(in_register_00000034,
                 filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                 super_QFlagsStorage<QDir::Filter>.i);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  save.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&save,dbg);
  QDebug::resetFormat(dbg);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  if (in_EDX == 0xffffffff) {
    latin1_14.m_data = "NoFilter";
    latin1_14.m_size = 8;
    QString::QString((QString *)&local_60,latin1_14);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
  }
  else {
    if ((in_EDX & 1) != 0) {
      latin1.m_data = "Dirs";
      latin1.m_size = 4;
      QString::QString((QString *)&local_60,latin1);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 10 & 1) != 0) {
      latin1_00.m_data = "AllDirs";
      latin1_00.m_size = 7;
      QString::QString((QString *)&local_60,latin1_00);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 2) != 0) {
      latin1_01.m_data = "Files";
      latin1_01.m_size = 5;
      QString::QString((QString *)&local_60,latin1_01);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 4) != 0) {
      latin1_02.m_data = "Drives";
      latin1_02.m_size = 6;
      QString::QString((QString *)&local_60,latin1_02);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 8) != 0) {
      latin1_03.m_data = "NoSymLinks";
      latin1_03.m_size = 10;
      QString::QString((QString *)&local_60,latin1_03);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 0xd & 1) != 0) {
      latin1_04.m_data = "NoDot";
      latin1_04.m_size = 5;
      QString::QString((QString *)&local_60,latin1_04);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 0xe & 1) != 0) {
      latin1_05.m_data = "NoDotDot";
      latin1_05.m_size = 8;
      QString::QString((QString *)&local_60,latin1_05);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((~in_EDX & 7) == 0) {
      latin1_06.m_data = "AllEntries";
      latin1_06.m_size = 10;
      QString::QString((QString *)&local_60,latin1_06);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 0x10) != 0) {
      latin1_07.m_data = "Readable";
      latin1_07.m_size = 8;
      QString::QString((QString *)&local_60,latin1_07);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 0x20) != 0) {
      latin1_08.m_data = "Writable";
      latin1_08.m_size = 8;
      QString::QString((QString *)&local_60,latin1_08);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 0x40) != 0) {
      latin1_09.m_data = "Executable";
      latin1_09.m_size = 10;
      QString::QString((QString *)&local_60,latin1_09);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((char)in_EDX < '\0') {
      latin1_10.m_data = "Modified";
      latin1_10.m_size = 8;
      QString::QString((QString *)&local_60,latin1_10);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 8 & 1) != 0) {
      latin1_11.m_data = "Hidden";
      latin1_11.m_size = 6;
      QString::QString((QString *)&local_60,latin1_11);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 9 & 1) != 0) {
      latin1_12.m_data = "System";
      latin1_12.m_size = 6;
      QString::QString((QString *)&local_60,latin1_12);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX >> 0xb & 1) == 0) goto LAB_00214c8f;
    latin1_13.m_data = "CaseSensitive";
    latin1_13.m_size = 0xd;
    QString::QString((QString *)&local_60,latin1_13);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
LAB_00214c8f:
  dbg->stream->noQuotes = true;
  pQVar3 = QDebug::operator<<(dbg,"QDir::Filters(");
  QListSpecialMethods<QString>::join
            ((QString *)&local_60,(QListSpecialMethods<QString> *)&local_48,(QChar)0x7c);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_60);
  QDebug::operator<<(pQVar3,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  pSVar2 = dbg->stream;
  dbg->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar2;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QDebugStateSaver::~QDebugStateSaver(&save);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QDir::Filters filters)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    QStringList flags;
    if (filters == QDir::NoFilter) {
        flags << "NoFilter"_L1;
    } else {
        if (filters & QDir::Dirs) flags << "Dirs"_L1;
        if (filters & QDir::AllDirs) flags << "AllDirs"_L1;
        if (filters & QDir::Files) flags << "Files"_L1;
        if (filters & QDir::Drives) flags << "Drives"_L1;
        if (filters & QDir::NoSymLinks) flags << "NoSymLinks"_L1;
        if (filters & QDir::NoDot) flags << "NoDot"_L1;
        if (filters & QDir::NoDotDot) flags << "NoDotDot"_L1;
        if ((filters & QDir::AllEntries) == QDir::AllEntries) flags << "AllEntries"_L1;
        if (filters & QDir::Readable) flags << "Readable"_L1;
        if (filters & QDir::Writable) flags << "Writable"_L1;
        if (filters & QDir::Executable) flags << "Executable"_L1;
        if (filters & QDir::Modified) flags << "Modified"_L1;
        if (filters & QDir::Hidden) flags << "Hidden"_L1;
        if (filters & QDir::System) flags << "System"_L1;
        if (filters & QDir::CaseSensitive) flags << "CaseSensitive"_L1;
    }
    debug.noquote() << "QDir::Filters(" << flags.join(u'|') << ')';
    return debug;
}